

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocSaveStream(TidyDocImpl *doc,StreamOut *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  TidyAttrSortStrategy strat;
  Bool BVar12;
  int iVar13;
  TidyAttrSortStrategy sortAttrStrat;
  Bool ppWithTabs;
  Bool escapeCDATA;
  Bool makeBare;
  Bool asciiChars;
  Bool makeClean;
  Bool dropComments;
  TidyTriState bodyOnly;
  Bool xhtmlOut;
  Bool xmlOut;
  Bool smartBOM;
  Bool outputBOM;
  Bool forceOutput;
  Bool showMarkup;
  StreamOut *out_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x10].v;
  uVar2 = (doc->config).value[0x45].v;
  uVar3 = (doc->config).value[0x4d].v;
  uVar4 = (doc->config).value[0x4d].v;
  uVar5 = (doc->config).value[0x19].v;
  uVar6 = (doc->config).value[0x1a].v;
  uVar7 = (doc->config).value[0x40].v;
  uVar8 = (doc->config).value[0x43].v;
  uVar9 = (doc->config).value[0x20].v;
  uVar10 = (doc->config).value[0x47].v;
  iVar13 = (int)(doc->config).value[0x1f].v;
  uVar11 = (doc->config).value[0x4a].v;
  strat = (TidyAttrSortStrategy)(doc->config).value[0x5b].v;
  if ((int)(doc->config).value[0x5e].v == 0) {
    prvTidyPPrintSpaces();
  }
  else {
    prvTidyPPrintTabs();
  }
  if ((int)uVar11 != 0) {
    prvTidyConvertCDATANodes(doc,&doc->root);
  }
  if ((int)uVar8 != 0) {
    prvTidyDropComments(doc,&doc->root);
  }
  if ((((int)uVar9 != 0) && (prvTidyDropFontElements(doc,&doc->root,(Node **)0x0), (int)uVar10 != 0)
      ) || (iVar13 != 0)) {
    prvTidyDowngradeTypography(doc,&doc->root);
  }
  if (iVar13 == 0) {
    prvTidyReplacePreformattedSpaces(doc,&doc->root);
  }
  else {
    prvTidyNormalizeSpaces(doc->lexer,&doc->root);
  }
  if (strat != TidySortAttrNone) {
    prvTidySortAttributes(&doc->root,strat);
  }
  if (((int)uVar1 != 0) && ((doc->errors == 0 || ((int)uVar2 != 0)))) {
    if (((int)uVar3 == 1) || ((doc->inputHadBOM != no && ((int)uVar4 == 2)))) {
      prvTidyoutBOM(out);
    }
    doc->docOut = out;
    if (((int)uVar5 == 0) || ((int)uVar6 != 0)) {
      BVar12 = showBodyOnly(doc,(TidyTriState)uVar7);
      if (BVar12 == no) {
        prvTidyPPrintTree(doc,0,0,&doc->root);
      }
      else {
        prvTidyPrintBody(doc);
      }
    }
    else {
      prvTidyPPrintXMLTree(doc,0,0,&doc->root);
    }
    prvTidyPFlushLine(doc,0);
    doc->docOut = (StreamOut *)0x0;
  }
  prvTidyResetConfigToSnapshot(doc);
  iVar13 = tidyDocStatus(doc);
  return iVar13;
}

Assistant:

int         tidyDocSaveStream( TidyDocImpl* doc, StreamOut* out )
{
    Bool showMarkup  = cfgBool( doc, TidyShowMarkup );
    Bool forceOutput = cfgBool( doc, TidyForceOutput );
#if SUPPORT_UTF16_ENCODINGS
    Bool outputBOM   = ( cfgAutoBool(doc, TidyOutputBOM) == TidyYesState );
    Bool smartBOM    = ( cfgAutoBool(doc, TidyOutputBOM) == TidyAutoState );
#endif
    Bool xmlOut      = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut    = cfgBool( doc, TidyXhtmlOut );
    TidyTriState bodyOnly    = cfgAutoBool( doc, TidyBodyOnly );

    Bool dropComments = cfgBool(doc, TidyHideComments);
    Bool makeClean    = cfgBool(doc, TidyMakeClean);
    Bool asciiChars   = cfgBool(doc, TidyAsciiChars);
    Bool makeBare     = cfgBool(doc, TidyMakeBare);
    Bool escapeCDATA  = cfgBool(doc, TidyEscapeCdata);
    Bool ppWithTabs   = cfgBool(doc, TidyPPrintTabs);
    TidyAttrSortStrategy sortAttrStrat = cfg(doc, TidySortAttributes);

    if (ppWithTabs)
        TY_(PPrintTabs)();
    else
        TY_(PPrintSpaces)();

    if (escapeCDATA)
        TY_(ConvertCDATANodes)(doc, &doc->root);

    if (dropComments)
        TY_(DropComments)(doc, &doc->root);

    if (makeClean)
    {
        /* noop */
        TY_(DropFontElements)(doc, &doc->root, NULL);
    }

    if ((makeClean && asciiChars) || makeBare)
        TY_(DowngradeTypography)(doc, &doc->root);

    if (makeBare)
        /* Note: no longer replaces &nbsp; in */
        /* attribute values / non-text tokens */
        TY_(NormalizeSpaces)(doc->lexer, &doc->root);
    else
        TY_(ReplacePreformattedSpaces)(doc, &doc->root);

    if ( sortAttrStrat != TidySortAttrNone )
        TY_(SortAttributes)(&doc->root, sortAttrStrat);

    if ( showMarkup && (doc->errors == 0 || forceOutput) )
    {
#if SUPPORT_UTF16_ENCODINGS
        /* Output a Byte Order Mark if required */
        if ( outputBOM || (doc->inputHadBOM && smartBOM) )
            TY_(outBOM)( out );
#endif

        /* No longer necessary. No DOCTYPE == HTML 3.2,
        ** which gives you only the basic character entities,
        ** which are safe in any browser.
        ** if ( !TY_(FindDocType)(doc) )
        **    TY_(SetOptionBool)( doc, TidyNumEntities, yes );
        */

        doc->docOut = out;
        if ( xmlOut && !xhtmlOut )
            TY_(PPrintXMLTree)( doc, NORMAL, 0, &doc->root );
        else if ( showBodyOnly( doc, bodyOnly ) )
            TY_(PrintBody)( doc );
        else
            TY_(PPrintTree)( doc, NORMAL, 0, &doc->root );

        TY_(PFlushLine)( doc, 0 );
        doc->docOut = NULL;
    }

    TY_(ResetConfigToSnapshot)( doc );
    return tidyDocStatus( doc );
}